

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O2

void __thiscall RenderTest_RadianceMatches_Test::TestBody(RenderTest_RadianceMatches_Test *this)

{
  ParamType *pPVar1;
  char *message;
  allocator<char> local_65;
  int local_64;
  AssertionResult gtest_ar;
  AssertHelper local_50 [4];
  string local_30;
  int local_c;
  
  pPVar1 = testing::WithParamInterface<TestIntegrator>::GetParam
                     (&(this->super_RenderTest).super_TestWithParam<TestIntegrator>.
                       super_WithParamInterface<TestIntegrator>);
  (*pPVar1->integrator->_vptr_Integrator[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"test.exr",(allocator<char> *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_30,(string *)local_50);
  CheckSceneAverage(&local_30,(pPVar1->scene).expected);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)local_50);
  if (pPVar1->integrator != (Integrator *)0x0) {
    (*pPVar1->integrator->_vptr_Integrator[1])();
  }
  local_64 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"test.exr",&local_65);
  std::__cxx11::string::string((string *)&local_30,(string *)local_50);
  local_c = remove(local_30._M_dataplus._M_p);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","remove(inTestDir(\"test.exr\").c_str())",&local_64,&local_c)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
               ,0x1aa,message);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}